

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::expression_is_non_value_type_array(CompilerGLSL *this,uint32_t ptr)

{
  bool bVar1;
  uint32_t id;
  TypedID<(spirv_cross::Types)1> id_00;
  SPIRType *pSVar2;
  SPIRVariable *pSVar3;
  bool local_49;
  SPIRType *backed_type;
  SPIRVariable *var;
  SPIRType *type;
  uint32_t ptr_local;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,ptr);
  bVar1 = VectorView<unsigned_int>::empty(&(pSVar2->array).super_VectorView<unsigned_int>);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else if (((this->backend).array_is_value_type & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr);
    if (pSVar3 == (SPIRVariable *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar3->super_IVariant).field_0xc);
      pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
      local_49 = false;
      if ((((this->backend).buffer_offset_array_is_value_type & 1U) == 0) &&
         (local_49 = false, *(int *)&(pSVar2->super_IVariant).field_0xc == 0xf)) {
        id_00 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar2->super_IVariant).self);
        local_49 = Compiler::has_member_decoration
                             (&this->super_Compiler,(TypeID)id_00.id,0,DecorationOffset);
      }
      this_local._7_1_ = local_49;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::expression_is_non_value_type_array(uint32_t ptr)
{
	auto &type = expression_type(ptr);
	if (type.array.empty())
		return false;

	if (!backend.array_is_value_type)
		return true;

	auto *var = maybe_get_backing_variable(ptr);
	if (!var)
		return false;

	auto &backed_type = get<SPIRType>(var->basetype);
	return !backend.buffer_offset_array_is_value_type && backed_type.basetype == SPIRType::Struct &&
	       has_member_decoration(backed_type.self, 0, DecorationOffset);
}